

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_GL.cpp
# Opt level: O0

void __thiscall
Diligent::SerializedShaderImpl::CreateShaderGL
          (SerializedShaderImpl *this,IReferenceCounters *pRefCounters,ShaderCreateInfo *ShaderCI,
          RENDER_DEVICE_TYPE DeviceType,IDataBlob **ppCompilerOutput)

{
  GraphicsAdapterInfo *local_60;
  undefined1 local_48 [8];
  CreateInfo GLShaderCI;
  IDataBlob **ppCompilerOutput_local;
  ShaderCreateInfo *pSStack_20;
  RENDER_DEVICE_TYPE DeviceType_local;
  ShaderCreateInfo *ShaderCI_local;
  IReferenceCounters *pRefCounters_local;
  SerializedShaderImpl *this_local;
  
  GLShaderCI.ppCompilerOutput = ppCompilerOutput;
  ppCompilerOutput_local._4_4_ = DeviceType;
  pSStack_20 = ShaderCI;
  ShaderCI_local = (ShaderCreateInfo *)pRefCounters;
  pRefCounters_local = (IReferenceCounters *)this;
  local_48 = (undefined1  [8])
             RenderDeviceBase<Diligent::SerializationEngineImplTraits>::GetDeviceInfo
                       (&this->m_pDevice->
                         super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>);
  GLShaderCI.DeviceInfo =
       (RenderDeviceInfo *)
       RenderDeviceBase<Diligent::SerializationEngineImplTraits>::GetAdapterInfo
                 (&this->m_pDevice->super_RenderDeviceBase<Diligent::SerializationEngineImplTraits>)
  ;
  if ((GLShaderCI.ppCompilerOutput == (IDataBlob **)0x0) ||
     (*GLShaderCI.ppCompilerOutput == (IDataBlob *)0x0)) {
    local_60 = (GraphicsAdapterInfo *)GLShaderCI.ppCompilerOutput;
  }
  else {
    local_60 = (GraphicsAdapterInfo *)0x0;
  }
  GLShaderCI.AdapterInfo = local_60;
  CreateShader<Diligent::(anonymous_namespace)::CompiledShaderGL,Diligent::ShaderGLImpl::CreateInfo,Diligent::SerializationDeviceImpl*,Diligent::RENDER_DEVICE_TYPE>
            (this,OpenGL,(IReferenceCounters *)ShaderCI_local,pSStack_20,(CreateInfo *)local_48,
             &this->m_pDevice,(RENDER_DEVICE_TYPE *)((long)&ppCompilerOutput_local + 4));
  return;
}

Assistant:

void SerializedShaderImpl::CreateShaderGL(IReferenceCounters*     pRefCounters,
                                          const ShaderCreateInfo& ShaderCI,
                                          RENDER_DEVICE_TYPE      DeviceType,
                                          IDataBlob**             ppCompilerOutput) noexcept(false)
{
    const ShaderGLImpl::CreateInfo GLShaderCI{
        m_pDevice->GetDeviceInfo(),
        m_pDevice->GetAdapterInfo(),
        // Do not overwrite compiler output from other APIs.
        // TODO: collect all outputs.
        ppCompilerOutput == nullptr || *ppCompilerOutput == nullptr ? ppCompilerOutput : nullptr,
    };

    CreateShader<CompiledShaderGL>(DeviceType::OpenGL, pRefCounters, ShaderCI, GLShaderCI, m_pDevice, DeviceType);
}